

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void benchmark::internal::BenchmarkImp::AddRange
               (vector<int,_std::allocator<int>_> *dst,int lo,int hi,int mult)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int32_t i;
  undefined8 in_stack_ffffffffffffff90;
  CheckHandler *pCVar1;
  value_type *in_stack_ffffffffffffff98;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar2;
  undefined4 in_stack_ffffffffffffffac;
  uint uVar3;
  CheckHandler in_stack_ffffffffffffffb0;
  CheckHandler local_40 [3];
  byte local_21;
  vector<int,_std::allocator<int>_> local_20;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_21 = 0;
  local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = in_ECX;
  local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = in_EDX;
  local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = in_ESI;
  if (in_ESI < 0) {
    in_stack_ffffffffffffffa0 = &local_20;
    CheckHandler::CheckHandler
              ((CheckHandler *)in_stack_ffffffffffffffb0.log_,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,iVar2);
    local_21 = 1;
    CheckHandler::GetLog((CheckHandler *)in_stack_ffffffffffffffa0);
  }
  else {
    GetNullLogInstance();
  }
  if ((local_21 & 1) != 0) {
    CheckHandler::~CheckHandler((CheckHandler *)&LAB_00165b4a);
  }
  if ((int)local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage <
      local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_) {
    pCVar1 = local_40;
    CheckHandler::CheckHandler
              ((CheckHandler *)in_stack_ffffffffffffffb0.log_,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               (char *)in_stack_ffffffffffffffa0,(char *)pCVar1,iVar2);
    CheckHandler::GetLog(pCVar1);
    CheckHandler::~CheckHandler((CheckHandler *)&LAB_00165bc9);
  }
  GetNullLogInstance();
  uVar3 = 0;
  if (local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ < 2) {
    pCVar1 = (CheckHandler *)&stack0xffffffffffffffb0;
    CheckHandler::CheckHandler
              ((CheckHandler *)in_stack_ffffffffffffffb0.log_,
               (char *)(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8) &
                       0xffffffffffffff),(char *)in_stack_ffffffffffffffa0,
               (char *)in_stack_ffffffffffffff98,(int)((ulong)pCVar1 >> 0x20));
    uVar3 = 0x1000000;
    CheckHandler::GetLog(pCVar1);
  }
  else {
    GetNullLogInstance();
  }
  if ((uVar3 & 0x1000000) == 0) {
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    for (iVar2 = 1;
        (iVar2 < (int)(0x7fffffff /
                      (long)local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_) &&
        (iVar2 < (int)local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage));
        iVar2 = local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_ * iVar2) {
      if (local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < iVar2) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
    if ((int)local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage !=
        local_20.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    return;
  }
  CheckHandler::~CheckHandler((CheckHandler *)&LAB_00165c56);
}

Assistant:

void BenchmarkImp::AddRange(std::vector<int>* dst, int lo, int hi, int mult) {
  CHECK_GE(lo, 0);
  CHECK_GE(hi, lo);
  CHECK_GE(mult, 2);

  // Add "lo"
  dst->push_back(lo);

  static const int kint32max = std::numeric_limits<int32_t>::max();

  // Now space out the benchmarks in multiples of "mult"
  for (int32_t i = 1; i < kint32max/mult; i *= mult) {
    if (i >= hi) break;
    if (i > lo) {
      dst->push_back(i);
    }
  }
  // Add "hi" (if different from "lo")
  if (hi != lo) {
    dst->push_back(hi);
  }
}